

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

int FIX::double_conversion::Bignum::Compare(Bignum *a,Bignum *b)

{
  bool bVar1;
  int iVar2;
  Chunk CVar3;
  Chunk CVar4;
  int index;
  int iVar5;
  
  bVar1 = IsClamped(a);
  if (!bVar1) {
    __assert_fail("a.IsClamped()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x26b,
                  "static int FIX::double_conversion::Bignum::Compare(const Bignum &, const Bignum &)"
                 );
  }
  bVar1 = IsClamped(b);
  if (bVar1) {
    index = a->exponent_ + a->used_digits_;
    iVar2 = b->exponent_ + b->used_digits_;
    iVar5 = -1;
    if ((iVar2 <= index) && (iVar5 = 1, index <= iVar2)) {
      do {
        iVar2 = b->exponent_;
        if (a->exponent_ < b->exponent_) {
          iVar2 = a->exponent_;
        }
        if (index <= iVar2) {
          return 0;
        }
        index = index + -1;
        CVar3 = BigitAt(a,index);
        CVar4 = BigitAt(b,index);
        if (CVar3 >= CVar4 && CVar3 != CVar4) {
          iVar5 = 1;
        }
        if (CVar3 < CVar4) {
          iVar5 = -1;
        }
      } while (CVar3 == CVar4);
    }
    return iVar5;
  }
  __assert_fail("b.IsClamped()",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                ,0x26c,
                "static int FIX::double_conversion::Bignum::Compare(const Bignum &, const Bignum &)"
               );
}

Assistant:

int Bignum::Compare(const Bignum& a, const Bignum& b) {
  ASSERT(a.IsClamped());
  ASSERT(b.IsClamped());
  int bigit_length_a = a.BigitLength();
  int bigit_length_b = b.BigitLength();
  if (bigit_length_a < bigit_length_b) return -1;
  if (bigit_length_a > bigit_length_b) return +1;
  for (int i = bigit_length_a - 1; i >= Min(a.exponent_, b.exponent_); --i) {
    Chunk bigit_a = a.BigitAt(i);
    Chunk bigit_b = b.BigitAt(i);
    if (bigit_a < bigit_b) return -1;
    if (bigit_a > bigit_b) return +1;
    // Otherwise they are equal up to this digit. Try the next digit.
  }
  return 0;
}